

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O2

int __thiscall
datadog::Dogstatsd::count
          (Dogstatsd *this,string *name,int64_t value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,double rate)

{
  ostream *poVar1;
  ssize_t sVar2;
  int in_R8D;
  ostringstream statd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0 [32];
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::ostream::_M_insert<long>((long)local_1a0);
  std::operator<<(poVar1,"|c");
  std::__cxx11::string::string(local_1c0,(string *)name);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,tags);
  sVar2 = send(this,(int)local_1c0,local_1e0,(size_t)&local_1f8,in_R8D);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return (int)sVar2;
}

Assistant:

int Dogstatsd::count( std::string name, int64_t value, std::vector<std::string> tags, double rate){
    std::ostringstream statd;
    statd << value << "|c";
    return send(name, statd.str(), tags, rate);
  }